

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_cod_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_image_t *poVar1;
  opj_tccp_t *poVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  OPJ_UINT32 OVar5;
  uint uVar6;
  opj_bool oVar7;
  opj_tcp_v2_t *poVar8;
  ulong uVar9;
  long lVar10;
  OPJ_UINT32 *pOVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 local_44;
  OPJ_UINT32 *local_40;
  OPJ_PROG_ORDER local_34;
  long lVar15;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar8 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar8 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  local_44 = p_header_size;
  if (4 < p_header_size) {
    poVar1 = p_j2k->m_private_image;
    opj_read_bytes_LE(p_header_data,&poVar8->csty,1);
    opj_read_bytes_LE(p_header_data + 1,(OPJ_UINT32 *)&local_34,1);
    poVar8->prg = local_34;
    opj_read_bytes_LE(p_header_data + 2,&poVar8->numlayers,2);
    OVar5 = (p_j2k->m_cp).m_specific_param.m_dec.m_layer;
    if (OVar5 == 0) {
      OVar5 = poVar8->numlayers;
    }
    poVar8->num_layers_to_decode = OVar5;
    opj_read_bytes_LE(p_header_data + 4,&poVar8->mct,1);
    auVar4 = _DAT_0014e400;
    local_44 = local_44 - 5;
    uVar9 = (ulong)poVar1->numcomps;
    if (uVar9 != 0) {
      uVar6 = poVar8->csty & 1;
      poVar2 = poVar8->tccps;
      lVar10 = uVar9 - 1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      auVar12 = auVar12 ^ _DAT_0014e400;
      auVar14 = _DAT_001500a0;
      auVar16 = _DAT_0014e3f0;
      do {
        auVar17 = auVar16 ^ auVar4;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                    iVar13 < auVar17._4_4_) & 1)) {
          *(uint *)((long)poVar2->stepsizes + lVar10 + -0x1c) = uVar6;
        }
        if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
            auVar17._12_4_ <= auVar12._12_4_) {
          *(uint *)((long)poVar2[1].stepsizes + lVar10 + -0x1c) = uVar6;
        }
        auVar17 = auVar14 ^ auVar4;
        iVar18 = auVar17._4_4_;
        if (iVar18 <= iVar13 && (iVar18 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
          *(uint *)((long)poVar2[2].stepsizes + lVar10 + -0x1c) = uVar6;
          *(uint *)((long)poVar2[3].stepsizes + lVar10 + -0x1c) = uVar6;
        }
        lVar15 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar15 + 4;
        lVar15 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar15 + 4;
        lVar10 = lVar10 + 0x10e0;
      } while ((uVar9 + 3 >> 2) * 0x10e0 - lVar10 != 0);
    }
    oVar7 = j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data + 5,&local_44,p_manager);
    if ((oVar7 != 0) && (local_44 == 0)) {
      if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
        poVar8 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
      }
      else {
        poVar8 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      }
      if (p_j2k->m_private_image->numcomps < 2) {
        return 1;
      }
      poVar2 = poVar8->tccps;
      uVar9 = (ulong)(poVar2->numresolutions << 2);
      local_40 = poVar2->prcw;
      pOVar11 = &poVar2[1].numresolutions;
      uVar6 = 1;
      do {
        uVar3 = *(undefined8 *)&poVar2->cblkh;
        *(undefined8 *)pOVar11 = *(undefined8 *)&poVar2->numresolutions;
        *(undefined8 *)(pOVar11 + 2) = uVar3;
        pOVar11[4] = poVar2->qmfbid;
        memcpy(pOVar11 + 0xca,local_40,uVar9);
        memcpy(pOVar11 + 0xeb,poVar2->prch,uVar9);
        uVar6 = uVar6 + 1;
        pOVar11 = pOVar11 + 0x10e;
      } while (uVar6 < p_j2k->m_private_image->numcomps);
      return 1;
    }
  }
  opj_event_msg_v2(p_manager,1,"Error reading COD marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_cod_v2 (
					opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	/* loop */
	OPJ_UINT32 i;
	OPJ_UINT32 l_tmp;
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_image_t *l_image = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* If we are in the first tile-part header of the current tile */
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* Make sure room is sufficient */
	if (p_header_size < 5) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_tcp->csty,1);		/* Scod */
	++p_header_data;
	opj_read_bytes(p_header_data,&l_tmp,1);				/* SGcod (A) */
	++p_header_data;
	l_tcp->prg = (OPJ_PROG_ORDER) l_tmp;
	opj_read_bytes(p_header_data,&l_tcp->numlayers,2);	/* SGcod (B) */
	p_header_data+=2;

	/* If user didn't set a number layer to decode take the max specify in the codestream. */
	if	(l_cp->m_specific_param.m_dec.m_layer) {
		l_tcp->num_layers_to_decode = l_cp->m_specific_param.m_dec.m_layer;
	}
	else {
		l_tcp->num_layers_to_decode = l_tcp->numlayers;
	}

	opj_read_bytes(p_header_data,&l_tcp->mct,1);		/* SGcod (C) */
	++p_header_data;

	p_header_size -= 5;
	for	(i = 0; i < l_image->numcomps; ++i) {
		l_tcp->tccps[i].csty = l_tcp->csty & J2K_CCP_CSTY_PRT;
	}

	if (! j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	/* Apply the coding style to other components of the current tile or the m_default_tcp*/
	j2k_copy_tile_component_parameters(p_j2k);

	/* Index */
#ifdef WIP_REMOVE_MSD
	if (p_j2k->cstr_info) {
		/*opj_codestream_info_t *l_cstr_info = p_j2k->cstr_info;*/
		p_j2k->cstr_info->prog = l_tcp->prg;
		p_j2k->cstr_info->numlayers = l_tcp->numlayers;
		p_j2k->cstr_info->numdecompos = (OPJ_INT32*) opj_malloc(l_image->numcomps * sizeof(OPJ_UINT32));
		for	(i = 0; i < l_image->numcomps; ++i) {
			p_j2k->cstr_info->numdecompos[i] = l_tcp->tccps[i].numresolutions - 1;
		}
	}
#endif

	return OPJ_TRUE;
}